

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trim.cpp
# Opt level: O0

string_t duckdb::TrimOperator<true,false>::Operation<duckdb::string_t,duckdb::string_t>
                   (string_t input,Vector *result)

{
  int iVar1;
  long lVar2;
  unsigned_long uVar3;
  char *pcVar4;
  Vector *in_RDX;
  char *output;
  idx_t end;
  utf8proc_ssize_t bytes;
  idx_t begin;
  utf8proc_uint8_t *str;
  utf8proc_int32_t codepoint;
  idx_t size;
  char *data;
  string_t target;
  string_t *in_stack_ffffffffffffff90;
  string_t *this;
  string_t *local_50;
  int local_3c;
  string_t *local_38;
  char *local_30;
  Vector *local_28;
  string_t local_20;
  anon_union_16_2_67f50693_for_value local_10;
  
  local_28 = in_RDX;
  local_30 = string_t::GetData(in_stack_ffffffffffffff90);
  local_38 = (string_t *)string_t::GetSize(&local_20);
  pcVar4 = local_30;
  for (local_50 = (string_t *)0x0; local_50 < local_38;
      local_50 = (string_t *)((long)&local_50->value + uVar3)) {
    in_stack_ffffffffffffff90 = (string_t *)(pcVar4 + (long)local_50);
    lVar2 = UnsafeNumericCast<long,unsigned_long,void>((long)local_38 - (long)local_50);
    lVar2 = duckdb::utf8proc_iterate((uchar *)in_stack_ffffffffffffff90,lVar2,&local_3c);
    iVar1 = duckdb::utf8proc_category(local_3c);
    if (iVar1 != 0x17) break;
    uVar3 = UnsafeNumericCast<unsigned_long,long,void>(lVar2);
  }
  this = local_38;
  local_10 = (anon_union_16_2_67f50693_for_value)
             duckdb::StringVector::EmptyString(local_28,(long)local_38 - (long)local_50);
  pcVar4 = string_t::GetDataWriteable(in_stack_ffffffffffffff90);
  memcpy(pcVar4,local_30 + (long)local_50,(long)this - (long)local_50);
  string_t::Finalize(this);
  return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)local_10.pointer;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, Vector &result) {
		auto data = input.GetData();
		auto size = input.GetSize();

		utf8proc_int32_t codepoint;
		auto str = reinterpret_cast<const utf8proc_uint8_t *>(data);

		// Find the first character that is not left trimmed
		idx_t begin = 0;
		if (LTRIM) {
			while (begin < size) {
				auto bytes =
				    utf8proc_iterate(str + begin, UnsafeNumericCast<utf8proc_ssize_t>(size - begin), &codepoint);
				D_ASSERT(bytes > 0);
				if (utf8proc_category(codepoint) != UTF8PROC_CATEGORY_ZS) {
					break;
				}
				begin += UnsafeNumericCast<idx_t>(bytes);
			}
		}

		// Find the last character that is not right trimmed
		idx_t end;
		if (RTRIM) {
			end = begin;
			for (auto next = begin; next < size;) {
				auto bytes = utf8proc_iterate(str + next, UnsafeNumericCast<utf8proc_ssize_t>(size - next), &codepoint);
				D_ASSERT(bytes > 0);
				next += UnsafeNumericCast<idx_t>(bytes);
				if (utf8proc_category(codepoint) != UTF8PROC_CATEGORY_ZS) {
					end = next;
				}
			}
		} else {
			end = size;
		}

		// Copy the trimmed string
		auto target = StringVector::EmptyString(result, end - begin);
		auto output = target.GetDataWriteable();
		memcpy(output, data + begin, end - begin);

		target.Finalize();
		return target;
	}